

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

void kj::ArrayDisposer::Dispose_<capnp::compiler::BrandedDecl>::destruct(void *ptr)

{
  long *plVar1;
  
  plVar1 = *(long **)((long)ptr + 0x70);
  if (plVar1 != (long *)0x0) {
    *(undefined8 *)((long)ptr + 0x70) = 0;
    (**(code **)**(undefined8 **)((long)ptr + 0x68))
              (*(undefined8 **)((long)ptr + 0x68),(long)plVar1 + *(long *)(*plVar1 + -0x10));
  }
  if (*ptr - 1U < 2) {
    *(undefined4 *)ptr = 0;
  }
  return;
}

Assistant:

static void destruct(void* ptr) {
    kj::dtor(*reinterpret_cast<T*>(ptr));
  }